

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomProperty::read(DomProperty *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringView other_11;
  QStringView other_12;
  QStringView other_13;
  QStringView other_14;
  QStringView other_15;
  QStringView other_16;
  QStringView other_17;
  QStringView other_18;
  QStringView other_19;
  QStringView other_20;
  QStringView other_21;
  QStringView other_22;
  QStringView other_23;
  QStringView other_24;
  QStringView other_25;
  QStringView other_26;
  QStringView other_27;
  QStringView other_28;
  QStringView other_29;
  QStringView other_30;
  QStringView other_31;
  bool bVar1;
  int iVar2;
  DomColor *this_00;
  DomFont *this_01;
  DomResourceIcon *this_02;
  DomResourcePixmap *this_03;
  DomPalette *this_04;
  DomPoint *this_05;
  DomRect *this_06;
  DomLocale *this_07;
  DomSizePolicy *this_08;
  DomSize *this_09;
  DomString *this_10;
  DomStringList *this_11;
  DomDate *this_12;
  DomTime *this_13;
  DomDateTime *this_14;
  DomPointF *this_15;
  DomRectF *this_16;
  DomSizeF *this_17;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  undefined4 in_register_00000034;
  DomProperty *size;
  long in_FS_OFFSET;
  DomBrush *v_20;
  DomUrl *v_19;
  DomChar *v_18;
  DomSizeF *v_17;
  DomRectF *v_16;
  DomPointF *v_15;
  DomDateTime *v_14;
  DomTime *v_13;
  DomDate *v_12;
  DomStringList *v_11;
  DomString *v_10;
  DomSize *v_9;
  DomSizePolicy *v_8;
  DomLocale *v_7;
  DomRect *v_6;
  DomPoint *v_5;
  DomPalette *v_4;
  DomResourcePixmap *v_3;
  DomResourceIcon *v_2;
  DomFont *v_1;
  DomColor *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_fffffffffffff608;
  float in_stack_fffffffffffff60c;
  DomProperty *in_stack_fffffffffffff610;
  DomBrush *in_stack_fffffffffffff618;
  undefined5 in_stack_fffffffffffff620;
  byte in_stack_fffffffffffff625;
  byte in_stack_fffffffffffff626;
  byte in_stack_fffffffffffff627;
  DomUrl *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff630;
  byte in_stack_fffffffffffff637;
  DomChar *in_stack_fffffffffffff638;
  undefined1 local_740 [64];
  undefined1 local_700 [144];
  undefined1 local_670 [304];
  bool local_540 [64];
  bool local_500 [64];
  undefined1 local_4c0 [264];
  undefined1 local_3b8 [304];
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  undefined1 local_208 [64];
  undefined1 local_1c8 [104];
  undefined1 local_160 [64];
  undefined1 local_120 [16];
  QLatin1StringView local_110;
  QStringView local_d0;
  QStringView local_98;
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  size = (DomProperty *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff610);
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff610);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1a5b6d);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffff628,
               CONCAT17(in_stack_fffffffffffff627,
                        CONCAT16(in_stack_fffffffffffff626,
                                 CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620))));
    QStringView::QStringView<QString,_true>
              ((QStringView *)
               CONCAT17(in_stack_fffffffffffff627,
                        CONCAT16(in_stack_fffffffffffff626,
                                 CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620))),
               &in_stack_fffffffffffff618->m_attr_brushStyle);
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff610,
                         (QStringView *)
                         CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    QString::~QString((QString *)0x1a5bd4);
    if (bVar1) {
      local_98 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1a5bee);
      QStringView::toString((QStringView *)in_stack_fffffffffffff610);
      setAttributeName(in_stack_fffffffffffff610,
                       (QString *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
      QString::~QString((QString *)0x1a5c35);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffff628,
                 CONCAT17(in_stack_fffffffffffff627,
                          CONCAT16(in_stack_fffffffffffff626,
                                   CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620))));
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(in_stack_fffffffffffff627,
                          CONCAT16(in_stack_fffffffffffff626,
                                   CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620))),
                 &in_stack_fffffffffffff618->m_attr_brushStyle);
      bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff610,
                           (QStringView *)
                           CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
      QString::~QString((QString *)0x1a5c91);
      if (bVar1) {
        local_d0 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1a5cab);
        iVar2 = QStringView::toInt((QStringView *)in_stack_fffffffffffff618,
                                   (bool *)in_stack_fffffffffffff610,(int)in_stack_fffffffffffff60c)
        ;
        setAttributeStdset(this,iVar2);
      }
      else {
        local_110 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff618,(size_t)in_stack_fffffffffffff610);
        ::operator+((QLatin1String *)in_stack_fffffffffffff610,
                    (QStringView *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                   CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        QXmlStreamReader::raiseError((QString *)size);
        QString::~QString((QString *)0x1a5d6a);
      }
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1a5d8b);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a799b;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_120._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_120._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_120 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffff628,
                 CONCAT17(in_stack_fffffffffffff627,
                          CONCAT16(in_stack_fffffffffffff626,
                                   CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620))));
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(in_stack_fffffffffffff627,
                          CONCAT16(in_stack_fffffffffffff626,
                                   CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620))),
                 &in_stack_fffffffffffff618->m_attr_brushStyle);
      other.m_size._7_1_ = in_stack_fffffffffffff637;
      other.m_size._0_7_ = in_stack_fffffffffffff630;
      other.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
      iVar2 = QStringView::compare
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),other,
                         CaseInsensitive);
      QString::~QString((QString *)0x1a5e6c);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(local_160,size,0);
        setElementBool(in_stack_fffffffffffff610,
                       (QString *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
        QString::~QString((QString *)0x1a5eb2);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)in_stack_fffffffffffff628,
                   CONCAT17(in_stack_fffffffffffff627,
                            CONCAT16(in_stack_fffffffffffff626,
                                     CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620)))
                  );
        QStringView::QStringView<QString,_true>
                  ((QStringView *)
                   CONCAT17(in_stack_fffffffffffff627,
                            CONCAT16(in_stack_fffffffffffff626,
                                     CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620)))
                   ,&in_stack_fffffffffffff618->m_attr_brushStyle);
        sVar3 = 0;
        other_00.m_size._7_1_ = in_stack_fffffffffffff637;
        other_00.m_size._0_7_ = in_stack_fffffffffffff630;
        other_00.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
        iVar2 = QStringView::compare
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),other_00,
                           CaseInsensitive);
        QString::~QString((QString *)0x1a5f20);
        if (iVar2 == 0) {
          this_00 = (DomColor *)operator_new(0x18);
          memset(this_00,0,0x18);
          DomColor::DomColor(this_00);
          DomColor::read(this_00,__fd,__buf_00,sVar3);
          setElementColor(in_stack_fffffffffffff610,
                          (DomColor *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))
          ;
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)in_stack_fffffffffffff628,
                     CONCAT17(in_stack_fffffffffffff627,
                              CONCAT16(in_stack_fffffffffffff626,
                                       CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620)
                                      )));
          QStringView::QStringView<QString,_true>
                    ((QStringView *)
                     CONCAT17(in_stack_fffffffffffff627,
                              CONCAT16(in_stack_fffffffffffff626,
                                       CONCAT15(in_stack_fffffffffffff625,in_stack_fffffffffffff620)
                                      )),&in_stack_fffffffffffff618->m_attr_brushStyle);
          other_01.m_size._7_1_ = in_stack_fffffffffffff637;
          other_01.m_size._0_7_ = in_stack_fffffffffffff630;
          other_01.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
          iVar2 = QStringView::compare
                            ((QStringView *)
                             CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),other_01,
                             CaseInsensitive);
          QString::~QString((QString *)0x1a6003);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(local_1c8,size,0);
            setElementCstring(in_stack_fffffffffffff610,
                              (QString *)
                              CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
            QString::~QString((QString *)0x1a6049);
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)in_stack_fffffffffffff628,
                       CONCAT17(in_stack_fffffffffffff627,
                                CONCAT16(in_stack_fffffffffffff626,
                                         CONCAT15(in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))));
            QStringView::QStringView<QString,_true>
                      ((QStringView *)
                       CONCAT17(in_stack_fffffffffffff627,
                                CONCAT16(in_stack_fffffffffffff626,
                                         CONCAT15(in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))),
                       &in_stack_fffffffffffff618->m_attr_brushStyle);
            other_02.m_size._7_1_ = in_stack_fffffffffffff637;
            other_02.m_size._0_7_ = in_stack_fffffffffffff630;
            other_02.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
            iVar2 = QStringView::compare
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                               other_02,CaseInsensitive);
            QString::~QString((QString *)0x1a60b7);
            if (iVar2 == 0) {
              QXmlStreamReader::readElementText(local_208,size,0);
              QString::toInt(&in_stack_fffffffffffff618->m_attr_brushStyle,
                             (bool *)in_stack_fffffffffffff610,(int)in_stack_fffffffffffff60c);
              setElementCursor(in_stack_fffffffffffff610,(int)in_stack_fffffffffffff60c);
              QString::~QString((QString *)0x1a610d);
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)in_stack_fffffffffffff628,
                         CONCAT17(in_stack_fffffffffffff627,
                                  CONCAT16(in_stack_fffffffffffff626,
                                           CONCAT15(in_stack_fffffffffffff625,
                                                    in_stack_fffffffffffff620))));
              QStringView::QStringView<QString,_true>
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffff627,
                                  CONCAT16(in_stack_fffffffffffff626,
                                           CONCAT15(in_stack_fffffffffffff625,
                                                    in_stack_fffffffffffff620))),
                         &in_stack_fffffffffffff618->m_attr_brushStyle);
              other_03.m_size._7_1_ = in_stack_fffffffffffff637;
              other_03.m_size._0_7_ = in_stack_fffffffffffff630;
              other_03.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
              iVar2 = QStringView::compare
                                ((QStringView *)
                                 CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                                 other_03,CaseInsensitive);
              QString::~QString((QString *)0x1a617b);
              if (iVar2 == 0) {
                QXmlStreamReader::readElementText(local_248,size,0);
                setElementCursorShape
                          (in_stack_fffffffffffff610,
                           (QString *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))
                ;
                QString::~QString((QString *)0x1a61c1);
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)in_stack_fffffffffffff628,
                           CONCAT17(in_stack_fffffffffffff627,
                                    CONCAT16(in_stack_fffffffffffff626,
                                             CONCAT15(in_stack_fffffffffffff625,
                                                      in_stack_fffffffffffff620))));
                QStringView::QStringView<QString,_true>
                          ((QStringView *)
                           CONCAT17(in_stack_fffffffffffff627,
                                    CONCAT16(in_stack_fffffffffffff626,
                                             CONCAT15(in_stack_fffffffffffff625,
                                                      in_stack_fffffffffffff620))),
                           &in_stack_fffffffffffff618->m_attr_brushStyle);
                other_04.m_size._7_1_ = in_stack_fffffffffffff637;
                other_04.m_size._0_7_ = in_stack_fffffffffffff630;
                other_04.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                iVar2 = QStringView::compare
                                  ((QStringView *)
                                   CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                                   other_04,CaseInsensitive);
                QString::~QString((QString *)0x1a622f);
                if (iVar2 == 0) {
                  QXmlStreamReader::readElementText(local_288,size,0);
                  setElementEnum(in_stack_fffffffffffff610,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
                  QString::~QString((QString *)0x1a6275);
                }
                else {
                  Qt::Literals::StringLiterals::operator____s
                            ((char16_t *)in_stack_fffffffffffff628,
                             CONCAT17(in_stack_fffffffffffff627,
                                      CONCAT16(in_stack_fffffffffffff626,
                                               CONCAT15(in_stack_fffffffffffff625,
                                                        in_stack_fffffffffffff620))));
                  QStringView::QStringView<QString,_true>
                            ((QStringView *)
                             CONCAT17(in_stack_fffffffffffff627,
                                      CONCAT16(in_stack_fffffffffffff626,
                                               CONCAT15(in_stack_fffffffffffff625,
                                                        in_stack_fffffffffffff620))),
                             &in_stack_fffffffffffff618->m_attr_brushStyle);
                  sVar3 = 0;
                  other_05.m_size._7_1_ = in_stack_fffffffffffff637;
                  other_05.m_size._0_7_ = in_stack_fffffffffffff630;
                  other_05.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                  iVar2 = QStringView::compare
                                    ((QStringView *)
                                     CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608),
                                     other_05,CaseInsensitive);
                  QString::~QString((QString *)0x1a62e3);
                  if (iVar2 == 0) {
                    this_01 = (DomFont *)operator_new(0x80);
                    memset(this_01,0,0x80);
                    DomFont::DomFont((DomFont *)in_stack_fffffffffffff610);
                    DomFont::read(this_01,__fd,__buf_01,sVar3);
                    setElementFont(in_stack_fffffffffffff610,
                                   (DomFont *)
                                   CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____s
                              ((char16_t *)in_stack_fffffffffffff628,
                               CONCAT17(in_stack_fffffffffffff627,
                                        CONCAT16(in_stack_fffffffffffff626,
                                                 CONCAT15(in_stack_fffffffffffff625,
                                                          in_stack_fffffffffffff620))));
                    QStringView::QStringView<QString,_true>
                              ((QStringView *)
                               CONCAT17(in_stack_fffffffffffff627,
                                        CONCAT16(in_stack_fffffffffffff626,
                                                 CONCAT15(in_stack_fffffffffffff625,
                                                          in_stack_fffffffffffff620))),
                               &in_stack_fffffffffffff618->m_attr_brushStyle);
                    sVar3 = 0;
                    other_06.m_size._7_1_ = in_stack_fffffffffffff637;
                    other_06.m_size._0_7_ = in_stack_fffffffffffff630;
                    other_06.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                    iVar2 = QStringView::compare
                                      ((QStringView *)
                                       CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608)
                                       ,other_06,CaseInsensitive);
                    QString::~QString((QString *)0x1a63c6);
                    if (iVar2 == 0) {
                      this_02 = (DomResourceIcon *)operator_new(0x98);
                      memset(this_02,0,0x98);
                      DomResourceIcon::DomResourceIcon((DomResourceIcon *)in_stack_fffffffffffff610)
                      ;
                      DomResourceIcon::read(this_02,__fd,__buf_02,sVar3);
                      setElementIconSet(in_stack_fffffffffffff610,
                                        (DomResourceIcon *)
                                        CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608
                                                ));
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____s
                                ((char16_t *)in_stack_fffffffffffff628,
                                 CONCAT17(in_stack_fffffffffffff627,
                                          CONCAT16(in_stack_fffffffffffff626,
                                                   CONCAT15(in_stack_fffffffffffff625,
                                                            in_stack_fffffffffffff620))));
                      QStringView::QStringView<QString,_true>
                                ((QStringView *)
                                 CONCAT17(in_stack_fffffffffffff627,
                                          CONCAT16(in_stack_fffffffffffff626,
                                                   CONCAT15(in_stack_fffffffffffff625,
                                                            in_stack_fffffffffffff620))),
                                 &in_stack_fffffffffffff618->m_attr_brushStyle);
                      sVar3 = 0;
                      other_07.m_size._7_1_ = in_stack_fffffffffffff637;
                      other_07.m_size._0_7_ = in_stack_fffffffffffff630;
                      other_07.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                      iVar2 = QStringView::compare
                                        ((QStringView *)
                                         CONCAT44(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_07,
                                         CaseInsensitive);
                      QString::~QString((QString *)0x1a64a9);
                      if (iVar2 == 0) {
                        this_03 = (DomResourcePixmap *)operator_new(0x58);
                        memset(this_03,0,0x58);
                        DomResourcePixmap::DomResourcePixmap
                                  ((DomResourcePixmap *)in_stack_fffffffffffff610);
                        DomResourcePixmap::read(this_03,__fd,__buf_03,sVar3);
                        setElementPixmap(in_stack_fffffffffffff610,
                                         (DomResourcePixmap *)
                                         CONCAT44(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____s
                                  ((char16_t *)in_stack_fffffffffffff628,
                                   CONCAT17(in_stack_fffffffffffff627,
                                            CONCAT16(in_stack_fffffffffffff626,
                                                     CONCAT15(in_stack_fffffffffffff625,
                                                              in_stack_fffffffffffff620))));
                        QStringView::QStringView<QString,_true>
                                  ((QStringView *)
                                   CONCAT17(in_stack_fffffffffffff627,
                                            CONCAT16(in_stack_fffffffffffff626,
                                                     CONCAT15(in_stack_fffffffffffff625,
                                                              in_stack_fffffffffffff620))),
                                   &in_stack_fffffffffffff618->m_attr_brushStyle);
                        sVar3 = 0;
                        other_08.m_size._7_1_ = in_stack_fffffffffffff637;
                        other_08.m_size._0_7_ = in_stack_fffffffffffff630;
                        other_08.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                        iVar2 = QStringView::compare
                                          ((QStringView *)
                                           CONCAT44(in_stack_fffffffffffff60c,
                                                    in_stack_fffffffffffff608),other_08,
                                           CaseInsensitive);
                        QString::~QString((QString *)0x1a658c);
                        if (iVar2 == 0) {
                          this_04 = (DomPalette *)operator_new(0x20);
                          memset(this_04,0,0x20);
                          DomPalette::DomPalette(this_04);
                          DomPalette::read(this_04,__fd,__buf_04,sVar3);
                          setElementPalette(in_stack_fffffffffffff610,
                                            (DomPalette *)
                                            CONCAT44(in_stack_fffffffffffff60c,
                                                     in_stack_fffffffffffff608));
                        }
                        else {
                          Qt::Literals::StringLiterals::operator____s
                                    ((char16_t *)in_stack_fffffffffffff628,
                                     CONCAT17(in_stack_fffffffffffff627,
                                              CONCAT16(in_stack_fffffffffffff626,
                                                       CONCAT15(in_stack_fffffffffffff625,
                                                                in_stack_fffffffffffff620))));
                          QStringView::QStringView<QString,_true>
                                    ((QStringView *)
                                     CONCAT17(in_stack_fffffffffffff627,
                                              CONCAT16(in_stack_fffffffffffff626,
                                                       CONCAT15(in_stack_fffffffffffff625,
                                                                in_stack_fffffffffffff620))),
                                     &in_stack_fffffffffffff618->m_attr_brushStyle);
                          sVar3 = 0;
                          other_09.m_size._7_1_ = in_stack_fffffffffffff637;
                          other_09.m_size._0_7_ = in_stack_fffffffffffff630;
                          other_09.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                          iVar2 = QStringView::compare
                                            ((QStringView *)
                                             CONCAT44(in_stack_fffffffffffff60c,
                                                      in_stack_fffffffffffff608),other_09,
                                             CaseInsensitive);
                          QString::~QString((QString *)0x1a666f);
                          if (iVar2 == 0) {
                            this_05 = (DomPoint *)operator_new(0xc);
                            memset(this_05,0,0xc);
                            DomPoint::DomPoint(this_05);
                            DomPoint::read(this_05,__fd,__buf_05,sVar3);
                            setElementPoint(in_stack_fffffffffffff610,
                                            (DomPoint *)
                                            CONCAT44(in_stack_fffffffffffff60c,
                                                     in_stack_fffffffffffff608));
                          }
                          else {
                            Qt::Literals::StringLiterals::operator____s
                                      ((char16_t *)in_stack_fffffffffffff628,
                                       CONCAT17(in_stack_fffffffffffff627,
                                                CONCAT16(in_stack_fffffffffffff626,
                                                         CONCAT15(in_stack_fffffffffffff625,
                                                                  in_stack_fffffffffffff620))));
                            QStringView::QStringView<QString,_true>
                                      ((QStringView *)
                                       CONCAT17(in_stack_fffffffffffff627,
                                                CONCAT16(in_stack_fffffffffffff626,
                                                         CONCAT15(in_stack_fffffffffffff625,
                                                                  in_stack_fffffffffffff620))),
                                       &in_stack_fffffffffffff618->m_attr_brushStyle);
                            sVar3 = 0;
                            other_10.m_size._7_1_ = in_stack_fffffffffffff637;
                            other_10.m_size._0_7_ = in_stack_fffffffffffff630;
                            other_10.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                            iVar2 = QStringView::compare
                                              ((QStringView *)
                                               CONCAT44(in_stack_fffffffffffff60c,
                                                        in_stack_fffffffffffff608),other_10,
                                               CaseInsensitive);
                            QString::~QString((QString *)0x1a6752);
                            if (iVar2 == 0) {
                              this_06 = (DomRect *)operator_new(0x14);
                              memset(this_06,0,0x14);
                              DomRect::DomRect(this_06);
                              DomRect::read(this_06,__fd,__buf_06,sVar3);
                              setElementRect(in_stack_fffffffffffff610,
                                             (DomRect *)
                                             CONCAT44(in_stack_fffffffffffff60c,
                                                      in_stack_fffffffffffff608));
                            }
                            else {
                              Qt::Literals::StringLiterals::operator____s
                                        ((char16_t *)in_stack_fffffffffffff628,
                                         CONCAT17(in_stack_fffffffffffff627,
                                                  CONCAT16(in_stack_fffffffffffff626,
                                                           CONCAT15(in_stack_fffffffffffff625,
                                                                    in_stack_fffffffffffff620))));
                              QStringView::QStringView<QString,_true>
                                        ((QStringView *)
                                         CONCAT17(in_stack_fffffffffffff627,
                                                  CONCAT16(in_stack_fffffffffffff626,
                                                           CONCAT15(in_stack_fffffffffffff625,
                                                                    in_stack_fffffffffffff620))),
                                         &in_stack_fffffffffffff618->m_attr_brushStyle);
                              other_11.m_size._7_1_ = in_stack_fffffffffffff637;
                              other_11.m_size._0_7_ = in_stack_fffffffffffff630;
                              other_11.m_data = (storage_type_conflict *)in_stack_fffffffffffff638;
                              iVar2 = QStringView::compare
                                                ((QStringView *)
                                                 CONCAT44(in_stack_fffffffffffff60c,
                                                          in_stack_fffffffffffff608),other_11,
                                                 CaseInsensitive);
                              QString::~QString((QString *)0x1a6835);
                              if (iVar2 == 0) {
                                QXmlStreamReader::readElementText(local_3b8,size,0);
                                setElementSet(in_stack_fffffffffffff610,
                                              (QString *)
                                              CONCAT44(in_stack_fffffffffffff60c,
                                                       in_stack_fffffffffffff608));
                                QString::~QString((QString *)0x1a687b);
                              }
                              else {
                                Qt::Literals::StringLiterals::operator____s
                                          ((char16_t *)in_stack_fffffffffffff628,
                                           CONCAT17(in_stack_fffffffffffff627,
                                                    CONCAT16(in_stack_fffffffffffff626,
                                                             CONCAT15(in_stack_fffffffffffff625,
                                                                      in_stack_fffffffffffff620))));
                                QStringView::QStringView<QString,_true>
                                          ((QStringView *)
                                           CONCAT17(in_stack_fffffffffffff627,
                                                    CONCAT16(in_stack_fffffffffffff626,
                                                             CONCAT15(in_stack_fffffffffffff625,
                                                                      in_stack_fffffffffffff620))),
                                           &in_stack_fffffffffffff618->m_attr_brushStyle);
                                sVar3 = 0;
                                other_12.m_size._7_1_ = in_stack_fffffffffffff637;
                                other_12.m_size._0_7_ = in_stack_fffffffffffff630;
                                other_12.m_data = (storage_type_conflict *)in_stack_fffffffffffff638
                                ;
                                iVar2 = QStringView::compare
                                                  ((QStringView *)
                                                   CONCAT44(in_stack_fffffffffffff60c,
                                                            in_stack_fffffffffffff608),other_12,
                                                   CaseInsensitive);
                                QString::~QString((QString *)0x1a68e9);
                                if (iVar2 == 0) {
                                  this_07 = (DomLocale *)operator_new(0x40);
                                  memset(this_07,0,0x40);
                                  DomLocale::DomLocale((DomLocale *)in_stack_fffffffffffff610);
                                  DomLocale::read(this_07,__fd,__buf_07,sVar3);
                                  setElementLocale(in_stack_fffffffffffff610,
                                                   (DomLocale *)
                                                   CONCAT44(in_stack_fffffffffffff60c,
                                                            in_stack_fffffffffffff608));
                                }
                                else {
                                  Qt::Literals::StringLiterals::operator____s
                                            ((char16_t *)in_stack_fffffffffffff628,
                                             CONCAT17(in_stack_fffffffffffff627,
                                                      CONCAT16(in_stack_fffffffffffff626,
                                                               CONCAT15(in_stack_fffffffffffff625,
                                                                        in_stack_fffffffffffff620)))
                                            );
                                  QStringView::QStringView<QString,_true>
                                            ((QStringView *)
                                             CONCAT17(in_stack_fffffffffffff627,
                                                      CONCAT16(in_stack_fffffffffffff626,
                                                               CONCAT15(in_stack_fffffffffffff625,
                                                                        in_stack_fffffffffffff620)))
                                             ,&in_stack_fffffffffffff618->m_attr_brushStyle);
                                  sVar3 = 0;
                                  other_13.m_size._7_1_ = in_stack_fffffffffffff637;
                                  other_13.m_size._0_7_ = in_stack_fffffffffffff630;
                                  other_13.m_data =
                                       (storage_type_conflict *)in_stack_fffffffffffff638;
                                  iVar2 = QStringView::compare
                                                    ((QStringView *)
                                                     CONCAT44(in_stack_fffffffffffff60c,
                                                              in_stack_fffffffffffff608),other_13,
                                                     CaseInsensitive);
                                  QString::~QString((QString *)0x1a69cc);
                                  if (iVar2 == 0) {
                                    this_08 = (DomSizePolicy *)operator_new(0x50);
                                    memset(this_08,0,0x50);
                                    DomSizePolicy::DomSizePolicy
                                              ((DomSizePolicy *)in_stack_fffffffffffff610);
                                    DomSizePolicy::read(this_08,__fd,__buf_08,sVar3);
                                    setElementSizePolicy
                                              (in_stack_fffffffffffff610,
                                               (DomSizePolicy *)
                                               CONCAT44(in_stack_fffffffffffff60c,
                                                        in_stack_fffffffffffff608));
                                  }
                                  else {
                                    Qt::Literals::StringLiterals::operator____s
                                              ((char16_t *)in_stack_fffffffffffff628,
                                               CONCAT17(in_stack_fffffffffffff627,
                                                        CONCAT16(in_stack_fffffffffffff626,
                                                                 CONCAT15(in_stack_fffffffffffff625,
                                                                          in_stack_fffffffffffff620)
                                                                )));
                                    QStringView::QStringView<QString,_true>
                                              ((QStringView *)
                                               CONCAT17(in_stack_fffffffffffff627,
                                                        CONCAT16(in_stack_fffffffffffff626,
                                                                 CONCAT15(in_stack_fffffffffffff625,
                                                                          in_stack_fffffffffffff620)
                                                                )),
                                               &in_stack_fffffffffffff618->m_attr_brushStyle);
                                    sVar3 = 0;
                                    other_14.m_size._7_1_ = in_stack_fffffffffffff637;
                                    other_14.m_size._0_7_ = in_stack_fffffffffffff630;
                                    other_14.m_data =
                                         (storage_type_conflict *)in_stack_fffffffffffff638;
                                    iVar2 = QStringView::compare
                                                      ((QStringView *)
                                                       CONCAT44(in_stack_fffffffffffff60c,
                                                                in_stack_fffffffffffff608),other_14,
                                                       CaseInsensitive);
                                    QString::~QString((QString *)0x1a6aaf);
                                    if (iVar2 == 0) {
                                      this_09 = (DomSize *)operator_new(0xc);
                                      memset(this_09,0,0xc);
                                      DomSize::DomSize(this_09);
                                      DomSize::read(this_09,__fd,__buf_09,sVar3);
                                      setElementSize(in_stack_fffffffffffff610,
                                                     (DomSize *)
                                                     CONCAT44(in_stack_fffffffffffff60c,
                                                              in_stack_fffffffffffff608));
                                    }
                                    else {
                                      Qt::Literals::StringLiterals::operator____s
                                                ((char16_t *)in_stack_fffffffffffff628,
                                                 CONCAT17(in_stack_fffffffffffff627,
                                                          CONCAT16(in_stack_fffffffffffff626,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))));
                                      QStringView::QStringView<QString,_true>
                                                ((QStringView *)
                                                 CONCAT17(in_stack_fffffffffffff627,
                                                          CONCAT16(in_stack_fffffffffffff626,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))),
                                                 &in_stack_fffffffffffff618->m_attr_brushStyle);
                                      sVar3 = 0;
                                      other_15.m_size._7_1_ = in_stack_fffffffffffff637;
                                      other_15.m_size._0_7_ = in_stack_fffffffffffff630;
                                      other_15.m_data =
                                           (storage_type_conflict *)in_stack_fffffffffffff638;
                                      iVar2 = QStringView::compare
                                                        ((QStringView *)
                                                         CONCAT44(in_stack_fffffffffffff60c,
                                                                  in_stack_fffffffffffff608),
                                                         other_15,CaseInsensitive);
                                      QString::~QString((QString *)0x1a6b92);
                                      if (iVar2 == 0) {
                                        this_10 = (DomString *)operator_new(0x98);
                                        memset(this_10,0,0x98);
                                        DomString::DomString((DomString *)in_stack_fffffffffffff610)
                                        ;
                                        DomString::read(this_10,__fd,__buf_10,sVar3);
                                        setElementString(in_stack_fffffffffffff610,
                                                         (DomString *)
                                                         CONCAT44(in_stack_fffffffffffff60c,
                                                                  in_stack_fffffffffffff608));
                                      }
                                      else {
                                        Qt::Literals::StringLiterals::operator____s
                                                  ((char16_t *)in_stack_fffffffffffff628,
                                                   CONCAT17(in_stack_fffffffffffff627,
                                                            CONCAT16(in_stack_fffffffffffff626,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))));
                                        QStringView::QStringView<QString,_true>
                                                  ((QStringView *)
                                                   CONCAT17(in_stack_fffffffffffff627,
                                                            CONCAT16(in_stack_fffffffffffff626,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                        sVar3 = 0;
                                        other_16.m_size._7_1_ = in_stack_fffffffffffff637;
                                        other_16.m_size._0_7_ = in_stack_fffffffffffff630;
                                        other_16.m_data =
                                             (storage_type_conflict *)in_stack_fffffffffffff638;
                                        iVar2 = QStringView::compare
                                                          ((QStringView *)
                                                           CONCAT44(in_stack_fffffffffffff60c,
                                                                    in_stack_fffffffffffff608),
                                                           other_16,CaseInsensitive);
                                        QString::~QString((QString *)0x1a6c75);
                                        if (iVar2 == 0) {
                                          this_11 = (DomStringList *)operator_new(0x98);
                                          memset(this_11,0,0x98);
                                          DomStringList::DomStringList
                                                    ((DomStringList *)in_stack_fffffffffffff610);
                                          DomStringList::read(this_11,__fd,__buf_11,sVar3);
                                          setElementStringList
                                                    (in_stack_fffffffffffff610,
                                                     (DomStringList *)
                                                     CONCAT44(in_stack_fffffffffffff60c,
                                                              in_stack_fffffffffffff608));
                                        }
                                        else {
                                          Qt::Literals::StringLiterals::operator____s
                                                    ((char16_t *)in_stack_fffffffffffff628,
                                                     CONCAT17(in_stack_fffffffffffff627,
                                                              CONCAT16(in_stack_fffffffffffff626,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))));
                                          QStringView::QStringView<QString,_true>
                                                    ((QStringView *)
                                                     CONCAT17(in_stack_fffffffffffff627,
                                                              CONCAT16(in_stack_fffffffffffff626,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                          other_17.m_size._7_1_ = in_stack_fffffffffffff637;
                                          other_17.m_size._0_7_ = in_stack_fffffffffffff630;
                                          other_17.m_data =
                                               (storage_type_conflict *)in_stack_fffffffffffff638;
                                          iVar2 = QStringView::compare
                                                            ((QStringView *)
                                                             CONCAT44(in_stack_fffffffffffff60c,
                                                                      in_stack_fffffffffffff608),
                                                             other_17,CaseInsensitive);
                                          QString::~QString((QString *)0x1a6d58);
                                          if (iVar2 == 0) {
                                            QXmlStreamReader::readElementText(local_4c0,size,0);
                                            QString::toInt(&in_stack_fffffffffffff618->
                                                            m_attr_brushStyle,
                                                           (bool *)in_stack_fffffffffffff610,
                                                           (int)in_stack_fffffffffffff60c);
                                            setElementNumber(in_stack_fffffffffffff610,
                                                             (int)in_stack_fffffffffffff60c);
                                            QString::~QString((QString *)0x1a6dae);
                                          }
                                          else {
                                            Qt::Literals::StringLiterals::operator____s
                                                      ((char16_t *)in_stack_fffffffffffff628,
                                                       CONCAT17(in_stack_fffffffffffff627,
                                                                CONCAT16(in_stack_fffffffffffff626,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))));
                                            QStringView::QStringView<QString,_true>
                                                      ((QStringView *)
                                                       CONCAT17(in_stack_fffffffffffff627,
                                                                CONCAT16(in_stack_fffffffffffff626,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                            other_18.m_size._7_1_ = in_stack_fffffffffffff637;
                                            other_18.m_size._0_7_ = in_stack_fffffffffffff630;
                                            other_18.m_data =
                                                 (storage_type_conflict *)in_stack_fffffffffffff638;
                                            iVar2 = QStringView::compare
                                                              ((QStringView *)
                                                               CONCAT44(in_stack_fffffffffffff60c,
                                                                        in_stack_fffffffffffff608),
                                                               other_18,CaseInsensitive);
                                            QString::~QString((QString *)0x1a6e1c);
                                            if (iVar2 == 0) {
                                              QXmlStreamReader::readElementText(local_500,size,0);
                                              QString::toFloat(local_500);
                                              setElementFloat(in_stack_fffffffffffff610,
                                                              in_stack_fffffffffffff60c);
                                              QString::~QString((QString *)0x1a6e6b);
                                            }
                                            else {
                                              Qt::Literals::StringLiterals::operator____s
                                                        ((char16_t *)in_stack_fffffffffffff628,
                                                         CONCAT17(in_stack_fffffffffffff627,
                                                                  CONCAT16(in_stack_fffffffffffff626
                                                                           ,CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))));
                                              QStringView::QStringView<QString,_true>
                                                        ((QStringView *)
                                                         CONCAT17(in_stack_fffffffffffff627,
                                                                  CONCAT16(in_stack_fffffffffffff626
                                                                           ,CONCAT15(
                                                  in_stack_fffffffffffff625,
                                                  in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                              other_19.m_size._7_1_ = in_stack_fffffffffffff637;
                                              other_19.m_size._0_7_ = in_stack_fffffffffffff630;
                                              other_19.m_data =
                                                   (storage_type_conflict *)
                                                   in_stack_fffffffffffff638;
                                              iVar2 = QStringView::compare
                                                                ((QStringView *)
                                                                 CONCAT44(in_stack_fffffffffffff60c,
                                                                          in_stack_fffffffffffff608)
                                                                 ,other_19,CaseInsensitive);
                                              QString::~QString((QString *)0x1a6ed9);
                                              if (iVar2 == 0) {
                                                QXmlStreamReader::readElementText(local_540,size,0);
                                                QString::toDouble(local_540);
                                                setElementDouble(in_stack_fffffffffffff610,
                                                                 (double)CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                QString::~QString((QString *)0x1a6f28);
                                              }
                                              else {
                                                Qt::Literals::StringLiterals::operator____s
                                                          ((char16_t *)in_stack_fffffffffffff628,
                                                           CONCAT17(in_stack_fffffffffffff627,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                QStringView::QStringView<QString,_true>
                                                          ((QStringView *)
                                                           CONCAT17(in_stack_fffffffffffff627,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                sVar3 = 0;
                                                other_20.m_size._7_1_ = in_stack_fffffffffffff637;
                                                other_20.m_size._0_7_ = in_stack_fffffffffffff630;
                                                other_20.m_data =
                                                     (storage_type_conflict *)
                                                     in_stack_fffffffffffff638;
                                                iVar2 = QStringView::compare
                                                                  ((QStringView *)
                                                                   CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_20,
                                                  CaseInsensitive);
                                                QString::~QString((QString *)0x1a6f96);
                                                if (iVar2 == 0) {
                                                  this_12 = (DomDate *)operator_new(0x10);
                                                  memset(this_12,0,0x10);
                                                  DomDate::DomDate(this_12);
                                                  DomDate::read(this_12,__fd,__buf_12,sVar3);
                                                  setElementDate(in_stack_fffffffffffff610,
                                                                 (DomDate *)
                                                                 CONCAT44(in_stack_fffffffffffff60c,
                                                                          in_stack_fffffffffffff608)
                                                                );
                                                }
                                                else {
                                                  Qt::Literals::StringLiterals::operator____s
                                                            ((char16_t *)in_stack_fffffffffffff628,
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_21.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_21.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_21.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_21,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a7079);
                                                  if (iVar2 == 0) {
                                                    this_13 = (DomTime *)operator_new(0x10);
                                                    memset(this_13,0,0x10);
                                                    DomTime::DomTime(this_13);
                                                    DomTime::read(this_13,__fd,__buf_13,sVar3);
                                                    setElementTime(in_stack_fffffffffffff610,
                                                                   (DomTime *)
                                                                   CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_22.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_22.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_22.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_22,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a7159);
                                                  if (iVar2 == 0) {
                                                    this_14 = (DomDateTime *)operator_new(0x1c);
                                                    memset(this_14,0,0x1c);
                                                    DomDateTime::DomDateTime(this_14);
                                                    DomDateTime::read(this_14,__fd,__buf_14,sVar3);
                                                    setElementDateTime(in_stack_fffffffffffff610,
                                                                       (DomDateTime *)
                                                                       CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_23.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_23.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_23.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_23,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a722d);
                                                  if (iVar2 == 0) {
                                                    this_15 = (DomPointF *)operator_new(0x18);
                                                    memset(this_15,0,0x18);
                                                    DomPointF::DomPointF(this_15);
                                                    DomPointF::read(this_15,__fd,__buf_15,sVar3);
                                                    setElementPointF(in_stack_fffffffffffff610,
                                                                     (DomPointF *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_24.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_24.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_24.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_24,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a7301);
                                                  if (iVar2 == 0) {
                                                    this_16 = (DomRectF *)operator_new(0x28);
                                                    memset(this_16,0,0x28);
                                                    DomRectF::DomRectF(this_16);
                                                    DomRectF::read(this_16,__fd,__buf_16,sVar3);
                                                    setElementRectF(in_stack_fffffffffffff610,
                                                                    (DomRectF *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_25.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_25.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_25.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_25,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a73d5);
                                                  if (iVar2 == 0) {
                                                    this_17 = (DomSizeF *)operator_new(0x18);
                                                    memset(this_17,0,0x18);
                                                    DomSizeF::DomSizeF(this_17);
                                                    DomSizeF::read(this_17,__fd,__buf_17,sVar3);
                                                    setElementSizeF(in_stack_fffffffffffff610,
                                                                    (DomSizeF *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  other_26.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_26.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_26.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_26,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a74a9);
                                                  if (iVar2 == 0) {
                                                    QXmlStreamReader::readElementText
                                                              (local_670,size,0);
                                                    QString::toLongLong(&in_stack_fffffffffffff618->
                                                                         m_attr_brushStyle,
                                                                        (bool *)
                                                  in_stack_fffffffffffff610,
                                                  (int)in_stack_fffffffffffff60c);
                                                  setElementLongLong(in_stack_fffffffffffff610,
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  QString::~QString((QString *)0x1a74fd);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_27.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_27.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_27.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_27,
                                                  CaseInsensitive);
                                                  QString::~QString((QString *)0x1a7568);
                                                  if (iVar2 == 0) {
                                                    in_stack_fffffffffffff638 =
                                                         (DomChar *)operator_new(8);
                                                    memset(in_stack_fffffffffffff638,0,8);
                                                    DomChar::DomChar(in_stack_fffffffffffff638);
                                                    DomChar::read(in_stack_fffffffffffff638,__fd,
                                                                  __buf_18,sVar3);
                                                    setElementChar(in_stack_fffffffffffff610,
                                                                   (DomChar *)
                                                                   CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_28.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_28.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_28.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_28,
                                                  CaseInsensitive);
                                                  in_stack_fffffffffffff637 = iVar2 != 0 ^ 0xff;
                                                  QString::~QString((QString *)0x1a763c);
                                                  if ((in_stack_fffffffffffff637 & 1) == 0) {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  other_29.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_29.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_29.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_29,
                                                  CaseInsensitive);
                                                  in_stack_fffffffffffff627 = iVar2 != 0 ^ 0xff;
                                                  QString::~QString((QString *)0x1a7710);
                                                  if ((in_stack_fffffffffffff627 & 1) == 0) {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  other_30.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_30.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_30.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_30,
                                                  CaseInsensitive);
                                                  in_stack_fffffffffffff626 = iVar2 != 0 ^ 0xff;
                                                  QString::~QString((QString *)0x1a77ce);
                                                  if ((in_stack_fffffffffffff626 & 1) == 0) {
                                                    Qt::Literals::StringLiterals::operator____s
                                                              ((char16_t *)in_stack_fffffffffffff628
                                                               ,CONCAT17(in_stack_fffffffffffff627,
                                                                         CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))));
                                                  QStringView::QStringView<QString,_true>
                                                            ((QStringView *)
                                                             CONCAT17(in_stack_fffffffffffff627,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffff626,
                                                  CONCAT15(in_stack_fffffffffffff625,
                                                           in_stack_fffffffffffff620))),
                                                  &in_stack_fffffffffffff618->m_attr_brushStyle);
                                                  sVar3 = 0;
                                                  other_31.m_size._7_1_ = in_stack_fffffffffffff637;
                                                  other_31.m_size._0_7_ = in_stack_fffffffffffff630;
                                                  other_31.m_data =
                                                       (storage_type_conflict *)
                                                       in_stack_fffffffffffff638;
                                                  iVar2 = QStringView::compare
                                                                    ((QStringView *)
                                                                     CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608),other_31,
                                                  CaseInsensitive);
                                                  in_stack_fffffffffffff625 = iVar2 != 0 ^ 0xff;
                                                  QString::~QString((QString *)0x1a788d);
                                                  if ((in_stack_fffffffffffff625 & 1) == 0) {
                                                    in_stack_fffffffffffff610 = size;
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff618,
                                                               (size_t)size);
                                                    ::operator+((QLatin1String *)
                                                                in_stack_fffffffffffff610,
                                                                (QStringView *)
                                                                CONCAT44(in_stack_fffffffffffff60c,
                                                                         in_stack_fffffffffffff608))
                                                    ;
                                                    ::QStringBuilder::operator_cast_to_QString
                                                              ((
                                                  QStringBuilder<QLatin1String,_const_QStringView_&>
                                                  *)CONCAT44(in_stack_fffffffffffff60c,
                                                             in_stack_fffffffffffff608));
                                                  QXmlStreamReader::raiseError
                                                            (&in_stack_fffffffffffff610->m_attr_name
                                                            );
                                                  QString::~QString((QString *)0x1a797a);
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff618 =
                                                         (DomBrush *)operator_new(0x38);
                                                    memset(in_stack_fffffffffffff618,0,0x38);
                                                    DomBrush::DomBrush((DomBrush *)
                                                                       in_stack_fffffffffffff610);
                                                    DomBrush::read(in_stack_fffffffffffff618,__fd,
                                                                   __buf_20,sVar3);
                                                    setElementBrush(in_stack_fffffffffffff610,
                                                                    (DomBrush *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  }
                                                  else {
                                                    QXmlStreamReader::readElementText
                                                              (local_740,size,0);
                                                    QString::toULongLong
                                                              (&in_stack_fffffffffffff618->
                                                                m_attr_brushStyle,
                                                               (bool *)in_stack_fffffffffffff610,
                                                               (int)in_stack_fffffffffffff60c);
                                                    setElementULongLong(in_stack_fffffffffffff610,
                                                                        CONCAT44(
                                                  in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608));
                                                  QString::~QString((QString *)0x1a7822);
                                                  }
                                                  }
                                                  else {
                                                    QXmlStreamReader::readElementText
                                                              (local_700,size,0);
                                                    QString::toUInt(&in_stack_fffffffffffff618->
                                                                     m_attr_brushStyle,
                                                                    (bool *)
                                                  in_stack_fffffffffffff610,
                                                  (int)in_stack_fffffffffffff60c);
                                                  setElementUInt(in_stack_fffffffffffff610,
                                                                 (uint)in_stack_fffffffffffff60c);
                                                  QString::~QString((QString *)0x1a7763);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffff628 =
                                                         (DomUrl *)operator_new(0x10);
                                                    memset(in_stack_fffffffffffff628,0,0x10);
                                                    DomUrl::DomUrl(in_stack_fffffffffffff628);
                                                    DomUrl::read(in_stack_fffffffffffff628,__fd,
                                                                 __buf_19,sVar3);
                                                    setElementUrl(in_stack_fffffffffffff610,
                                                                  (DomUrl *)
                                                                  CONCAT44(in_stack_fffffffffffff60c
                                                                           ,
                                                  in_stack_fffffffffffff608));
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while (iVar2 != 5);
LAB_001a799b:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1a79a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomProperty::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"stdset"_s) {
            setAttributeStdset(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"bool"_s, Qt::CaseInsensitive)) {
                setElementBool(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            if (!tag.compare(u"cstring"_s, Qt::CaseInsensitive)) {
                setElementCstring(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"cursor"_s, Qt::CaseInsensitive)) {
                setElementCursor(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"cursorshape"_s, Qt::CaseInsensitive)) {
                setElementCursorShape(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"enum"_s, Qt::CaseInsensitive)) {
                setElementEnum(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"font"_s, Qt::CaseInsensitive)) {
                auto *v = new DomFont();
                v->read(reader);
                setElementFont(v);
                continue;
            }
            if (!tag.compare(u"iconset"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResourceIcon();
                v->read(reader);
                setElementIconSet(v);
                continue;
            }
            if (!tag.compare(u"pixmap"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResourcePixmap();
                v->read(reader);
                setElementPixmap(v);
                continue;
            }
            if (!tag.compare(u"palette"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPalette();
                v->read(reader);
                setElementPalette(v);
                continue;
            }
            if (!tag.compare(u"point"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPoint();
                v->read(reader);
                setElementPoint(v);
                continue;
            }
            if (!tag.compare(u"rect"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRect();
                v->read(reader);
                setElementRect(v);
                continue;
            }
            if (!tag.compare(u"set"_s, Qt::CaseInsensitive)) {
                setElementSet(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"locale"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLocale();
                v->read(reader);
                setElementLocale(v);
                continue;
            }
            if (!tag.compare(u"sizepolicy"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSizePolicy();
                v->read(reader);
                setElementSizePolicy(v);
                continue;
            }
            if (!tag.compare(u"size"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSize();
                v->read(reader);
                setElementSize(v);
                continue;
            }
            if (!tag.compare(u"string"_s, Qt::CaseInsensitive)) {
                auto *v = new DomString();
                v->read(reader);
                setElementString(v);
                continue;
            }
            if (!tag.compare(u"stringlist"_s, Qt::CaseInsensitive)) {
                auto *v = new DomStringList();
                v->read(reader);
                setElementStringList(v);
                continue;
            }
            if (!tag.compare(u"number"_s, Qt::CaseInsensitive)) {
                setElementNumber(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"float"_s, Qt::CaseInsensitive)) {
                setElementFloat(reader.readElementText().toFloat());
                continue;
            }
            if (!tag.compare(u"double"_s, Qt::CaseInsensitive)) {
                setElementDouble(reader.readElementText().toDouble());
                continue;
            }
            if (!tag.compare(u"date"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDate();
                v->read(reader);
                setElementDate(v);
                continue;
            }
            if (!tag.compare(u"time"_s, Qt::CaseInsensitive)) {
                auto *v = new DomTime();
                v->read(reader);
                setElementTime(v);
                continue;
            }
            if (!tag.compare(u"datetime"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDateTime();
                v->read(reader);
                setElementDateTime(v);
                continue;
            }
            if (!tag.compare(u"pointf"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPointF();
                v->read(reader);
                setElementPointF(v);
                continue;
            }
            if (!tag.compare(u"rectf"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRectF();
                v->read(reader);
                setElementRectF(v);
                continue;
            }
            if (!tag.compare(u"sizef"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSizeF();
                v->read(reader);
                setElementSizeF(v);
                continue;
            }
            if (!tag.compare(u"longlong"_s, Qt::CaseInsensitive)) {
                setElementLongLong(reader.readElementText().toLongLong());
                continue;
            }
            if (!tag.compare(u"char"_s, Qt::CaseInsensitive)) {
                auto *v = new DomChar();
                v->read(reader);
                setElementChar(v);
                continue;
            }
            if (!tag.compare(u"url"_s, Qt::CaseInsensitive)) {
                auto *v = new DomUrl();
                v->read(reader);
                setElementUrl(v);
                continue;
            }
            if (!tag.compare(u"uint"_s, Qt::CaseInsensitive)) {
                setElementUInt(reader.readElementText().toUInt());
                continue;
            }
            if (!tag.compare(u"ulonglong"_s, Qt::CaseInsensitive)) {
                setElementULongLong(reader.readElementText().toULongLong());
                continue;
            }
            if (!tag.compare(u"brush"_s, Qt::CaseInsensitive)) {
                auto *v = new DomBrush();
                v->read(reader);
                setElementBrush(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}